

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::quatd>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *result)

{
  pointer *ppqVar1;
  pointer pqVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  char c;
  double4 v;
  quatd value;
  char local_71;
  string local_70;
  quatd local_50;
  
  pqVar2 = (result->
           super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    (result->super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
    _M_impl.super__Vector_impl_data._M_finish = pqVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<double,4ul>(this,(array<double,_4UL> *)&local_70);
    if (bVar5) {
      local_50.real = (double)local_70._M_dataplus._M_p;
      local_50.imag._M_elems[0] = (double)local_70._M_string_length;
      local_50.imag._M_elems[1] = (double)local_70.field_2._M_allocated_capacity;
      local_50.imag._M_elems[2] = (double)local_70.field_2._8_8_;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>::
        _M_realloc_insert<tinyusdz::value::quatd_const&>
                  ((vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>> *)result,
                   iVar3,&local_50);
      }
      else {
        ((iVar3._M_current)->imag)._M_elems[2] = (double)local_70.field_2._8_8_;
        (iVar3._M_current)->real = (double)local_70._M_dataplus._M_p;
        ((iVar3._M_current)->imag)._M_elems[0] = (double)local_70._M_string_length;
        ((iVar3._M_current)->imag)._M_elems[1] = (double)local_70.field_2._M_allocated_capacity;
        ppqVar1 = &(result->
                   super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppqVar1 = *ppqVar1 + 1;
      }
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Not starting with the value of requested type.\n","");
      PushError(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003d8faf;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_71);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_71 == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_70);
              cVar7 = ((char)local_70._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if ((char)local_70._M_dataplus._M_p != end_symbol && bVar5) goto LAB_003d8ef0;
            }
          }
          else {
LAB_003d8ef0:
            if (local_71 == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<double,4ul>(this,(array<double,_4UL> *)&local_70);
                if (bVar5) {
                  local_50.real = (double)local_70._M_dataplus._M_p;
                  local_50.imag._M_elems[0] = (double)local_70._M_string_length;
                  local_50.imag._M_elems[1] = (double)local_70.field_2._M_allocated_capacity;
                  local_50.imag._M_elems[2] = (double)local_70.field_2._8_8_;
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>::
                    _M_realloc_insert<tinyusdz::value::quatd_const&>
                              ((vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>
                                *)result,iVar3,&local_50);
                  }
                  else {
                    ((iVar3._M_current)->imag)._M_elems[2] = (double)local_70.field_2._8_8_;
                    (iVar3._M_current)->real = (double)local_70._M_dataplus._M_p;
                    ((iVar3._M_current)->imag)._M_elems[0] = (double)local_70._M_string_length;
                    ((iVar3._M_current)->imag)._M_elems[1] =
                         (double)local_70.field_2._M_allocated_capacity;
                    ppqVar1 = &(result->
                               super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppqVar1 = *ppqVar1 + 1;
                  }
                  cVar7 = '\0';
                }
                else {
                  cVar7 = '\x03';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_003d8faf:
        if ((result->
            super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Empty array.\n","");
        PushError(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}